

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O0

rk_s32 kmpp_obj_get_by_sptr(KmppObj *obj,KmppShmPtr *sptr,char *caller)

{
  uint uVar1;
  char *name;
  MppTrie local_70;
  char *str;
  rk_u32 val;
  rk_s32 ret;
  rk_u8 *uptr;
  KmppObjDefImpl *def;
  KmppObjImpl *impl;
  KmppObjImpl *local_38;
  KmppObjs *__tmp;
  KmppObjs *p;
  char *caller_local;
  KmppShmPtr *sptr_local;
  KmppObj *obj_local;
  
  p = (KmppObjs *)caller;
  caller_local = (char *)sptr;
  sptr_local = (KmppShmPtr *)obj;
  if (objs == (KmppObjs *)0x0) {
    if ((kmpp_obj_debug & 1) != 0) {
      _mpp_log_l(4,"kmpp_obj","kmpp objs srv not init at %s\n",(char *)0x0,caller);
    }
    local_38 = (KmppObjImpl *)0x0;
  }
  else {
    local_38 = (KmppObjImpl *)objs;
  }
  impl = local_38;
  __tmp = (KmppObjs *)local_38;
  if (caller_local == (char *)0x0) {
    local_70 = (MppTrie)0x0;
  }
  else {
    local_70 = *(MppTrie *)caller_local;
  }
  if (((sptr_local == (KmppShmPtr *)0x0) || (caller_local == (char *)0x0)) ||
     (local_70 == (MppTrie)0x0)) {
    _mpp_log_l(2,"kmpp_obj","invalid param obj %p sptr %p uptr %p at %s\n","kmpp_obj_get_by_sptr",
               sptr_local,caller_local,local_70,p);
    obj_local._4_4_ = -1;
  }
  else {
    (sptr_local->field_0).uaddr = 0;
    if (local_38 == (KmppObjImpl *)0x0) {
      obj_local._4_4_ = -1;
    }
    else {
      uVar1 = *(uint *)((long)local_70 + (long)*(int *)&local_38->trie);
      if (uVar1 == 0) {
        _mpp_log_l(2,"kmpp_obj","invalid obj name offset %d at %s\n","kmpp_obj_get_by_sptr",0,p);
        obj_local._4_4_ = -1;
      }
      else {
        name = (char *)((long)&local_38->shm->field_0 + (ulong)uVar1);
        kmpp_objdef_get(&uptr,name);
        if (uptr == (rk_u8 *)0x0) {
          _mpp_log_l(2,"kmpp_obj","failed to get objdef %p - %s at %s\n","kmpp_obj_get_by_sptr",name
                     ,name,p);
          obj_local._4_4_ = -1;
        }
        else {
          def = (KmppObjDefImpl *)mpp_osal_calloc("kmpp_obj_get_by_sptr",0x30);
          if (def == (KmppObjDefImpl *)0x0) {
            _mpp_log_l(2,"kmpp_obj","malloc obj impl %d failed at %s\n","kmpp_obj_get_by_sptr",0x30,
                       p);
            obj_local._4_4_ = -1;
          }
          else {
            def->trie = *(MppTrie *)(uptr + 0x18);
            *(rk_u8 **)&def->index = uptr;
            *(undefined8 *)&def->entry_size = *(undefined8 *)uptr;
            *(undefined4 *)&def->name = 1;
            def[1].trie = local_70;
            *(long *)&def[1].index = (long)local_70 + (long)__tmp->entry_offset;
            if ((kmpp_obj_debug & 1) != 0) {
              _mpp_log_l(4,"kmpp_obj","get obj %s - %p by sptr [u:k] %llx:%llx at %s\n",(char *)0x0,
                         *(undefined8 *)(uptr + 0x18),def,*(undefined8 *)caller_local,
                         *(undefined8 *)(caller_local + 8),p);
            }
            *(KmppObjDefImpl **)(*(long *)caller_local + (long)__tmp->priv_offset) = def;
            (sptr_local->field_0).uptr = def;
            obj_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return obj_local._4_4_;
}

Assistant:

rk_s32 kmpp_obj_get_by_sptr(KmppObj *obj, KmppShmPtr *sptr, const char *caller)
{
    KmppObjs *p = get_objs(caller);
    KmppObjImpl *impl;
    KmppObjDefImpl *def;
    rk_u8 *uptr = sptr ? sptr->uptr : NULL;
    rk_s32 ret = rk_nok;

    if (!obj || !sptr || !uptr) {
        mpp_loge_f("invalid param obj %p sptr %p uptr %p at %s\n",
                   obj, sptr, uptr, caller);
        return ret;
    }

    *obj = NULL;

    if (!p)
        return ret;

    {
        rk_u32 val = *((rk_u32 *)(uptr + p->name_offset));
        char *str;

        if (!val) {
            mpp_loge_f("invalid obj name offset %d at %s\n", val, caller);
            return ret;
        }

        str = (char *)p->root + val;
        kmpp_objdef_get((KmppObjDef *)&def, str);
        if (!def) {
            mpp_loge_f("failed to get objdef %p - %s at %s\n", str, str, caller);
            return ret;
        }
    }

    impl = mpp_calloc(KmppObjImpl, 1);
    if (!impl) {
        mpp_loge_f("malloc obj impl %d failed at %s\n", sizeof(KmppObjImpl), caller);
        return ret;
    }

    impl->name = def->name;
    impl->def = def;
    impl->trie = def->trie;
    impl->need_free = 1;
    impl->shm = (KmppShmPtr *)uptr;
    impl->entry = uptr + p->entry_offset;

    obj_dbg_flow("get obj %s - %p by sptr [u:k] %llx:%llx at %s\n", def->name,
                 impl, sptr->uaddr, sptr->kaddr, caller);

    /* write userspace object address to share memory userspace private value */
    *(RK_U64 *)U64_TO_PTR(sptr->uaddr + p->priv_offset) = (RK_U64)(intptr_t)impl;

    *obj = impl;

    return rk_ok;
}